

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::logQueueInfo(CLIntercept *this,cl_device_id device,cl_command_queue queue)

{
  uint uVar1;
  cl_icd_dispatch *pcVar2;
  cl_command_queue in_RDX;
  CLIntercept *in_RDI;
  float __x;
  float __x_00;
  float fVar3;
  float __x_01;
  cl_uint queueIndex;
  cl_int errorCode_qf;
  cl_uint queueFamily;
  cl_command_queue_properties props;
  char *deviceName;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff28;
  lock_guard<std::mutex> *in_stack_ffffffffffffff30;
  char **in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  cl_device_info cVar4;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  CLIntercept *in_stack_ffffffffffffff70;
  undefined4 local_78;
  uint local_74;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  CEnumNameMap *in_stack_ffffffffffffff98;
  long local_48;
  void *local_40;
  uint local_24;
  cl_command_queue local_18;
  
  cVar4 = (cl_device_info)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_18 = in_RDX;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_24 = 0;
  logf(in_RDI,__x);
  local_40 = (void *)0x0;
  uVar1 = allocateAndGetDeviceInfoString
                    (in_stack_ffffffffffffff70,
                     (cl_device_id)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     cVar4,in_stack_ffffffffffffff58);
  local_24 = local_24 | uVar1;
  local_48 = 0;
  pcVar2 = dispatch(in_RDI);
  uVar1 = (*pcVar2->clGetCommandQueueInfo)(local_18,0x1093,8,&local_48,(size_t *)0x0);
  local_24 = uVar1 | local_24;
  if (local_24 == 0) {
    fVar3 = logf(in_RDI,__x_00);
    in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 & 0xffffff;
    if (local_48 != 0) {
      enumName(in_RDI);
      CEnumNameMap::name_command_queue_properties_abi_cxx11_
                (in_stack_ffffffffffffff98,
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffff94 = 0x1000000;
      fVar3 = (float)std::__cxx11::string::c_str();
    }
    logf(in_RDI,fVar3);
    if ((in_stack_ffffffffffffff94 & 0x1000000) != 0) {
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    }
  }
  pcVar2 = dispatch(in_RDI);
  local_74 = (*pcVar2->clGetCommandQueueInfo)
                       (local_18,0x418c,4,&stack0xffffffffffffff90,(size_t *)0x0);
  local_78 = 0;
  pcVar2 = dispatch(in_RDI);
  uVar1 = (*pcVar2->clGetCommandQueueInfo)(local_18,0x418d,4,&local_78,(size_t *)0x0);
  local_74 = uVar1 | local_74;
  if (local_74 == 0) {
    fVar3 = logf(in_RDI,__x_01);
    logf(in_RDI,fVar3);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f647c);
  return;
}

Assistant:

void CLIntercept::logQueueInfo(
    const cl_device_id device,
    const cl_command_queue queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    logf( "Queue Info for %p:\n", queue );

    char*   deviceName = NULL;
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_NAME,
        deviceName );
    cl_command_queue_properties props = 0;
    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_PROPERTIES,
        sizeof(props),
        &props,
        NULL );
    if( errorCode == CL_SUCCESS )
    {
        logf( "    For device: %s\n", deviceName );
        logf( "    Queue properties: %s\n",
            props == 0 ?
            "(None)" :
            enumName().name_command_queue_properties(props).c_str() );
    }

    // Queue family information, may not be supported for all devices.
    cl_uint queueFamily = 0;
    cl_int errorCode_qf = dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_FAMILY_INTEL,
        sizeof(queueFamily),
        &queueFamily,
        NULL );
    cl_uint queueIndex = 0;
    errorCode_qf |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_INDEX_INTEL,
        sizeof(queueIndex),
        &queueIndex,
        NULL );
    if( errorCode_qf == CL_SUCCESS )
    {
        logf( "    Queue family: %u\n", queueFamily );
        logf( "    Queue index: %u\n", queueIndex );
    }

    delete [] deviceName;
}